

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveAlign::CDirectiveAlign(CDirectiveAlign *this,ArgumentList *args)

{
  pointer exp;
  bool bVar1;
  int iVar2;
  int *Result;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveAlign_00171ac0;
  CExpressionCommandList::CExpressionCommandList(&this->fillExpression);
  exp = (args->entries).
        super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
        super__Vector_impl_data._M_start;
  if ((args->entries).super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish == exp) {
    iVar2 = (*Arch->_vptr_CArchitecture[5])();
    this->alignment = iVar2;
  }
  else {
    Result = &this->alignment;
    bVar1 = ConvertExpression(&exp->text,Result);
    if (!bVar1) {
      Logger::printError<std::__cxx11::wstring>
                (FatalError,L"Invalid alignment %s",
                 &((args->entries).
                   super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_start)->text);
    }
    bVar1 = isPowerOfTwo(*Result);
    if (!bVar1) {
      Logger::printError<int>(Error,L"Invalid alignment %d",Result);
    }
  }
  FileManager::getVirtualAddress(g_fileManager);
  return;
}

Assistant:

CDirectiveAlign::CDirectiveAlign(ArgumentList& args)
{
	if (args.size() >= 1)
	{
		if (ConvertExpression(args[0].text,alignment) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid alignment %s",args[0].text);
		}
		if (isPowerOfTwo(alignment) == false)
		{
			Logger::printError(Logger::Error,L"Invalid alignment %d",alignment);
		}
	} else {
		alignment = Arch->GetWordSize();
	}

	int num = computePadding();
}